

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O0

Abc_Cex_t * Bmc_CexEssentialBits(Gia_Man_t *p,Abc_Cex_t *pCexState,Abc_Cex_t *pCexCare,int fVerbose)

{
  Abc_Cex_t *pCex;
  int iVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  bool bVar4;
  int local_48;
  int fPrevStatus;
  int fEqual;
  int b;
  Abc_Cex_t *pPrev;
  Abc_Cex_t *pTemp;
  Abc_Cex_t *pNew;
  Abc_Cex_t *pAStack_20;
  int fVerbose_local;
  Abc_Cex_t *pCexCare_local;
  Abc_Cex_t *pCexState_local;
  Gia_Man_t *p_local;
  
  _fEqual = (Abc_Cex_t *)0x0;
  local_48 = 0;
  bVar4 = false;
  pNew._4_4_ = fVerbose;
  pAStack_20 = pCexCare;
  pCexCare_local = pCexState;
  pCexState_local = (Abc_Cex_t *)p;
  if (pCexState->nBits != pCexCare->nBits) {
    __assert_fail("pCexState->nBits == pCexCare->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                  ,0x2f8,
                  "Abc_Cex_t *Bmc_CexEssentialBits(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t *, int)");
  }
  iVar1 = Gia_ManCiNum(p);
  pTemp = Abc_CexAlloc(0,iVar1,pCexCare_local->iFrame + 1);
  pTemp->iFrame = pCexCare_local->iFrame;
  pTemp->iPo = pCexCare_local->iPo;
  for (fPrevStatus = 0; fPrevStatus < pCexCare_local->nBits; fPrevStatus = fPrevStatus + 1) {
    iVar1 = Abc_InfoHasBit((uint *)(pAStack_20 + 1),fPrevStatus);
    if (iVar1 != 0) {
      iVar3 = fPrevStatus % pAStack_20->nPis;
      iVar1 = Gia_ManPiNum((Gia_Man_t *)pCexState_local);
      if (iVar3 < iVar1) {
        pPrev = Bmc_CexEssentialBitOne
                          ((Gia_Man_t *)pCexState_local,pCexCare_local,fPrevStatus,_fEqual,&local_48
                          );
        if (pPrev == (Abc_Cex_t *)0x0) {
          if ((local_48 != 0) && (bVar4)) {
            Abc_InfoSetBit((uint *)(pTemp + 1),fPrevStatus);
          }
        }
        else {
          Abc_CexFree(_fEqual);
          _fEqual = pPrev;
          pGVar2 = Gia_ManPo((Gia_Man_t *)pCexState_local,pCexCare_local->iPo);
          bVar4 = (*(ulong *)pGVar2 >> 0x3e & 1) == 0;
          pGVar2 = Gia_ManPo((Gia_Man_t *)pCexState_local,pCexCare_local->iPo);
          if ((*(ulong *)pGVar2 >> 0x3e & 1) == 0) {
            Abc_InfoSetBit((uint *)(pTemp + 1),fPrevStatus);
          }
        }
      }
      else {
        Abc_InfoSetBit((uint *)(pTemp + 1),fPrevStatus);
      }
    }
  }
  Abc_CexFreeP((Abc_Cex_t **)&fEqual);
  printf("Essentials:   ");
  pCex = pTemp;
  iVar1 = Gia_ManPiNum((Gia_Man_t *)pCexState_local);
  Bmc_CexPrint(pCex,iVar1,pNew._4_4_);
  return pTemp;
}

Assistant:

Abc_Cex_t * Bmc_CexEssentialBits( Gia_Man_t * p, Abc_Cex_t * pCexState, Abc_Cex_t * pCexCare, int fVerbose )
{
    Abc_Cex_t * pNew, * pTemp, * pPrev = NULL;
    int b, fEqual = 0, fPrevStatus = 0;
//    abctime clk = Abc_Clock();
    assert( pCexState->nBits == pCexCare->nBits );
    // start the counter-example
    pNew = Abc_CexAlloc( 0, Gia_ManCiNum(p), pCexState->iFrame + 1 );
    pNew->iFrame = pCexState->iFrame;
    pNew->iPo    = pCexState->iPo;
    // iterate through care-bits
    for ( b = 0; b < pCexState->nBits; b++ )
    {
        // skip don't-care bits
        if ( !Abc_InfoHasBit(pCexCare->pData, b) )
            continue;

        // skip state bits
        if ( b % pCexCare->nPis >= Gia_ManPiNum(p) )
        {
            Abc_InfoSetBit( pNew->pData, b );
            continue;
        }

        // check if this is an essential bit
        pTemp = Bmc_CexEssentialBitOne( p, pCexState, b, pPrev, &fEqual );
//        pTemp = Bmc_CexEssentialBitOne( p, pCexState, b, NULL, &fEqual );
        if ( pTemp == NULL )
        {
            if ( fEqual && fPrevStatus )
                Abc_InfoSetBit( pNew->pData, b );
            continue;
        }
//        Bmc_CexPrint( pTemp, Gia_ManPiNum(p), fVerbose );
        Abc_CexFree( pPrev );
        pPrev = pTemp;

        // record essential bit
        fPrevStatus = !Gia_ManPo(p, pCexState->iPo)->fMark1;
        if ( !Gia_ManPo(p, pCexState->iPo)->fMark1 )
            Abc_InfoSetBit( pNew->pData, b );
    }
    Abc_CexFreeP( &pPrev );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    printf( "Essentials:   " );
    Bmc_CexPrint( pNew, Gia_ManPiNum(p), fVerbose );
    return pNew;
}